

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O2

void __thiscall VM_Writer::write_if(VM_Writer *this,int label_number)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  poVar1 = (ostream *)this->out_file;
  std::__cxx11::to_string(&local_30,label_number);
  std::operator+(&local_50,"if-goto L",&local_30);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void VM_Writer::write_if(int label_number) {
    out_file << "if-goto L" + std::to_string(label_number) << std::endl;
}